

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O1

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::
PipelineStateBase<Diligent::RayTracingPipelineStateCreateInfo>
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,IReferenceCounters *pRefCounters,
          RenderDeviceImplType *pDevice,RayTracingPipelineStateCreateInfo *CreateInfo,
          bool bIsDeviceInternal)

{
  Uint64 *Args_1;
  byte *pbVar1;
  ulong uVar2;
  bool bVar3;
  RenderDeviceVkImpl *pRVar4;
  ulong uVar5;
  string msg;
  _Alloc_hider in_stack_ffffffffffffffc0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  size_t local_20;
  
  DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
  ::DeviceObjectBase(&this->
                      super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                     ,pRefCounters,pDevice,(PipelineStateDesc *)CreateInfo,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
  ).super_ObjectBase<Diligent::IPipelineStateVk>.super_RefCountedObject<Diligent::IPipelineStateVk>.
  super_IPipelineStateVk.super_IPipelineState.super_IDeviceObject.super_IObject =
       (IObject)&PTR_QueryInterface_00afe878;
  (this->m_AsyncInitializer)._M_t.
  super___uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
  .super__Head_base<0UL,_Diligent::AsyncInitializer_*,_false>._M_head_impl = (AsyncInitializer *)0x0
  ;
  this->m_ActiveShaderStages = SHADER_TYPE_UNKNOWN;
  bVar3 = true;
  if (((CreateInfo->super_PipelineStateCreateInfo).ppResourceSignatures !=
       (IPipelineResourceSignature **)0x0) &&
     ((CreateInfo->super_PipelineStateCreateInfo).ResourceSignaturesCount != 0)) {
    pbVar1 = (byte *)(CreateInfo->super_PipelineStateCreateInfo).pInternalData;
    if (pbVar1 == (byte *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = (bool)(*pbVar1 & 1);
    }
  }
  this->m_UsingImplicitSignature = bVar3;
  (this->m_Status)._M_i = PIPELINE_STATE_STATUS_UNINITIALIZED;
  this->m_SignatureCount = '\0';
  this->m_Signatures = (SignatureAutoPtrType *)0x0;
  (this->field_6).m_pGraphicsPipelineData = (GraphicsPipelineData *)0x0;
  this->m_IsDestructed = false;
  pRVar4 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                      );
  ValidatePSOCreateInfo<Diligent::RayTracingPipelineStateCreateInfo>
            ((IRenderDevice *)pRVar4,CreateInfo);
  pRVar4 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                      );
  uVar2 = (pRVar4->
          super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
          ).m_CmdQueueCount;
  uVar5 = ~(-1L << ((byte)uVar2 & 0x3f));
  if (0x3f < uVar2) {
    uVar5 = 0xffffffffffffffff;
  }
  Args_1 = &(this->
            super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
            ).m_Desc.ImmediateContextMask;
  if (((this->
       super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
       ).m_Desc.ImmediateContextMask & uVar5) == 0) {
    pRVar4 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
             ::GetDevice(&this->
                          super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                        );
    local_20 = (pRVar4->
               super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
               ).m_CmdQueueCount;
    FormatString<char[34],std::ios_base&(std::ios_base&),unsigned_long,char[24],unsigned_long,char[36]>
              ((string *)&stack0xffffffffffffffc0,(Diligent *)"No bits in the immediate mask (0x",
               (char (*) [34])std::hex,(_func_ios_base_ptr_ios_base_ptr *)Args_1,
               (unsigned_long *)") correspond to one of ",(char (*) [24])&local_20,
               (unsigned_long *)" available software command queues.",
               (char (*) [36])in_stack_ffffffffffffffc0._M_p);
    DebugAssertionFailed
              (in_stack_ffffffffffffffc0._M_p,"PipelineStateBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x1a2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffc0._M_p != &local_30) {
      operator_delete(in_stack_ffffffffffffffc0._M_p,local_30._M_allocated_capacity + 1);
    }
  }
  *Args_1 = *Args_1 & uVar5;
  return;
}

Assistant:

PipelineStateBase(IReferenceCounters*      pRefCounters,
                      RenderDeviceImplType*    pDevice,
                      const PSOCreateInfoType& CreateInfo,
                      bool                     bIsDeviceInternal = false) :
        TDeviceObjectBase{pRefCounters, pDevice, CreateInfo.PSODesc, bIsDeviceInternal},
        m_UsingImplicitSignature{CreateInfo.ppResourceSignatures == nullptr ||
                                 CreateInfo.ResourceSignaturesCount == 0 ||
                                 (GetInternalCreateFlags(CreateInfo) & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) != 0}
    {
        try
        {
            ValidatePSOCreateInfo(this->GetDevice(), CreateInfo);

            Uint64 DeviceQueuesMask = this->GetDevice()->GetCommandQueueMask();
            DEV_CHECK_ERR((this->m_Desc.ImmediateContextMask & DeviceQueuesMask) != 0,
                          "No bits in the immediate mask (0x", std::hex, this->m_Desc.ImmediateContextMask,
                          ") correspond to one of ", this->GetDevice()->GetCommandQueueCount(), " available software command queues.");
            this->m_Desc.ImmediateContextMask &= DeviceQueuesMask;
        }
        catch (...)
        {
            Destruct();
            throw;
        }
    }